

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O0

dependency<boost::ext::di::v1_3_0::scopes::deduce,_c,_c,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<c,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<c,_1,_double>_>_>_>
* __thiscall
boost::ext::di::v1_3_0::core::binder::operator()
          (injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_c,_c,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<c,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<c,_1,_double>_>_>_>_>
           *deps)

{
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_c,_c,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<c,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<c,_1,_double>_>_>_>
  *pdVar1;
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_c,_c,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<c,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<c,_1,_double>_>_>_>_>
  *in_RDI;
  type<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_c,_c,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<c,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<c,_1,_double>_>_>_>_&>
  local_9 [9];
  
  pdVar1 = operator()(in_RDI,local_9);
  return pdVar1;
}

Assistant:

static decltype(auto) resolve(TDeps* deps) noexcept {
    using dependency = dependency_concept<aux::decay_t<T>, TName>;
#if (defined(__CLANG__) && __CLANG__ >= 3'9)  //
    return resolve_(deps, aux::type<decltype(resolve_impl<TDefault, dependency>(aux::declval<TDeps*>()))>{});
#else
    return resolve_impl<TDefault, dependency>(deps);
#endif
  }